

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall VulkanHppGenerator::generateExtensionInspectionFile(VulkanHppGenerator *this)

{
  pointer pcVar1;
  pointer pFVar2;
  string *psVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pEVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  long lVar11;
  VulkanHppGenerator *pVVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  pointer pEVar15;
  string *psVar16;
  pointer __rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string previousLeave_6;
  string previousLeave;
  string previousEnter;
  string promotedExtensions;
  string obsoletedExtensions;
  string deprecatedExtensions;
  string versions;
  string promotedTo;
  string obsoletedBy;
  string deprecatedBy;
  string vulkan_extension_inspection_hpp;
  string str;
  string vulkanExtensionInspectionHppTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  string local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  VulkanHppGenerator *local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  pointer local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_930 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_970,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp","");
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_970,"/vulkan/");
  local_8e8.first._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar17 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p == paVar17) {
    local_8e8.first.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_8e8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  }
  else {
    local_8e8.first.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_8e8.first._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_8e8.first,(local_930->m_api)._M_dataplus._M_p,
                     (local_930->m_api)._M_string_length);
  paVar17 = &local_4e0.first.field_2;
  local_4e0.first._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.first._M_dataplus._M_p == paVar7) {
    local_4e0.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_4e0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_4e0.first._M_dataplus._M_p = (pointer)paVar17;
  }
  else {
    local_4e0.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_4e0.first._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_4e0.first,"_extension_inspection.hpp");
  local_740._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p == paVar7) {
    local_740.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_740.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  }
  else {
    local_740.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_740._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.first._M_dataplus._M_p != paVar17) {
    operator_delete(local_4e0.first._M_dataplus._M_p,
                    local_4e0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  std::operator+(&local_8e8.first,"VulkanHppGenerator: Generating ",&local_740);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_8e8.first," ...\n");
  local_4e0.first._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.first._M_dataplus._M_p == paVar7) {
    local_4e0.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_4e0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_4e0.first._M_dataplus._M_p = (pointer)paVar17;
  }
  else {
    local_4e0.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_4e0.first._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  SyncedMessageHandler::message(&messager,&local_4e0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.first._M_dataplus._M_p != paVar17) {
    operator_delete(local_4e0.first._M_dataplus._M_p,
                    local_4e0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_4e0.first._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"ExtensionInspection.hpp","")
  ;
  anon_unknown.dwarf_1900a8::readSnippet(&local_500,&local_4e0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.first._M_dataplus._M_p != paVar17) {
    operator_delete(local_4e0.first._M_dataplus._M_p,
                    local_4e0.first.field_2._M_allocated_capacity + 1);
  }
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  local_7e0._M_string_length = 0;
  local_7e0.field_2._M_local_buf[0] = '\0';
  local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  local_8e8.first._M_string_length = 0;
  local_8e8.first.field_2._M_allocated_capacity =
       local_8e8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_990.field_2;
    paVar7 = &local_908.field_2;
    psVar16 = &pEVar15->name;
    do {
      if (psVar16[-1].field_2._M_local_buf[8] == '\x01') {
        pVVar12 = local_930;
        getProtectFromTitle(&local_990,local_930,psVar16);
        generateProtection(&local_4e0,pVVar12,&local_990,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if (local_8e8.first._M_string_length == local_4e0.first._M_string_length) {
          if ((undefined1 *)local_8e8.first._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_8e8.first._M_dataplus._M_p,local_4e0.first._M_dataplus._M_p,
                         local_8e8.first._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928.field_2._M_allocated_capacity._0_2_ = 10;
          local_928._M_string_length = 1;
        }
        else {
          std::operator+(&local_6a0,"\n",&local_970);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_6a0,local_4e0.first._M_dataplus._M_p,
                             local_4e0.first._M_string_length);
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar8 = &pbVar5->field_2;
          if (paVar9 == paVar8) {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928._M_dataplus._M_p = (pointer)paVar9;
          }
          local_928._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_928,"{ \"");
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_9b0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_9b0,(psVar16->_M_dataplus)._M_p,psVar16->_M_string_length);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar9;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_950,"\", \"");
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar9) {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
        lVar11 = *(long *)((long)&psVar16[-2].field_2 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8a8,lVar11,psVar16[-1]._M_dataplus._M_p + lVar11);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          uVar13 = local_908.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
            uVar13 = local_8a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length)
          goto LAB_0010e2c3;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_8a8,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
        }
        else {
LAB_0010e2c3:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_908,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0._M_dataplus._M_p = (pointer)paVar8;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9d0,"\"}, ");
        local_990._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p == paVar9) {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_990.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_990._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_990._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_7e0,local_990._M_dataplus._M_p,local_990._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2)) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_8e8.first,&local_4e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_4e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.second._M_dataplus._M_p != &local_4e0.second.field_2) {
          operator_delete(local_4e0.second._M_dataplus._M_p,
                          local_4e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
          operator_delete(local_4e0.first._M_dataplus._M_p,
                          local_4e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      psVar3 = psVar16 + 0xb;
      psVar16 = (string *)(psVar16[0xc].field_2._M_local_buf + 8);
    } while ((pointer)&psVar3->field_2 != pEVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_4e0.first._M_dataplus._M_p = (pointer)local_7e0._M_string_length;
    local_4e0.first._M_string_length = (size_type)local_7e0._M_dataplus._M_p;
    bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_4e0,", ");
    if (!bVar18) {
      pcVar10 = 
      "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:172:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:173:76)]"
      ;
      goto LAB_001121f1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4e0.first,&local_7e0,0,(size_type)(local_7e0._M_string_length - 2));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_7e0,&local_4e0.first);
    paVar17 = &local_4e0.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.first._M_dataplus._M_p != paVar17) {
      operator_delete(local_4e0.first._M_dataplus._M_p,
                      local_4e0.first.field_2._M_allocated_capacity + 1);
    }
    if (local_970._M_string_length != 0) {
      std::operator+(&local_4e0.first,"\n",&local_970);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_7e0,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.first._M_dataplus._M_p != paVar17) {
        operator_delete(local_4e0.first._M_dataplus._M_p,
                        local_4e0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  local_760._M_string_length = 0;
  local_760.field_2._M_local_buf[0] = '\0';
  local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  local_8e8.first._M_string_length = 0;
  local_8e8.first.field_2._M_allocated_capacity =
       local_8e8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_990.field_2;
    paVar7 = &local_908.field_2;
    psVar16 = &pEVar15->name;
    do {
      if (psVar16[-1].field_2._M_local_buf[8] == '\x01') {
        pVVar12 = local_930;
        getProtectFromTitle(&local_990,local_930,psVar16);
        generateProtection(&local_4e0,pVVar12,&local_990,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if (local_8e8.first._M_string_length == local_4e0.first._M_string_length) {
          if ((undefined1 *)local_8e8.first._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_8e8.first._M_dataplus._M_p,local_4e0.first._M_dataplus._M_p,
                         local_8e8.first._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928.field_2._M_allocated_capacity._0_2_ = 10;
          local_928._M_string_length = 1;
        }
        else {
          std::operator+(&local_680,"\n",&local_970);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_680,local_4e0.first._M_dataplus._M_p,
                             local_4e0.first._M_string_length);
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar8 = &pbVar5->field_2;
          if (paVar9 == paVar8) {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928._M_dataplus._M_p = (pointer)paVar9;
          }
          local_928._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_928,"  if ( extension == \"");
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_9b0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_9b0,(psVar16->_M_dataplus)._M_p,psVar16->_M_string_length);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar9;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_950,"\" ) { return \"");
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar9) {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
        lVar11 = *(long *)((long)&psVar16[-2].field_2 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8a8,lVar11,psVar16[-1]._M_dataplus._M_p + lVar11);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          uVar13 = local_908.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
            uVar13 = local_8a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length)
          goto LAB_0010e9bc;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_8a8,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
        }
        else {
LAB_0010e9bc:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_908,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0._M_dataplus._M_p = (pointer)paVar8;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9d0,"\"; }");
        local_990._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p == paVar9) {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_990.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_990._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_990._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_760,local_990._M_dataplus._M_p,local_990._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2)) {
          operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_8e8.first,&local_4e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_4e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.second._M_dataplus._M_p != &local_4e0.second.field_2) {
          operator_delete(local_4e0.second._M_dataplus._M_p,
                          local_4e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
          operator_delete(local_4e0.first._M_dataplus._M_p,
                          local_4e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      psVar3 = psVar16 + 0xb;
      psVar16 = (string *)(psVar16[0xc].field_2._M_local_buf + 8);
    } while ((pointer)&psVar3->field_2 != pEVar6);
  }
  if (local_970._M_string_length != 0) {
    std::operator+(&local_4e0.first,"\n",&local_970);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_760,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
      operator_delete(local_4e0.first._M_dataplus._M_p,
                      local_4e0.first.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_760,"\n  return \"\";");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  local_780._M_string_length = 0;
  local_780.field_2._M_local_buf[0] = '\0';
  local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  local_8e8.first._M_string_length = 0;
  local_8e8.first.field_2._M_allocated_capacity =
       local_8e8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_990.field_2;
    paVar7 = &local_908.field_2;
    do {
      if ((pEVar15->obsoletedBy)._M_string_length != 0) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_990,local_930,&pEVar15->name);
        generateProtection(&local_4e0,pVVar12,&local_990,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if (local_8e8.first._M_string_length == local_4e0.first._M_string_length) {
          if ((undefined1 *)local_8e8.first._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_8e8.first._M_dataplus._M_p,local_4e0.first._M_dataplus._M_p,
                         local_8e8.first._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928.field_2._M_allocated_capacity._0_2_ = 10;
          local_928._M_string_length = 1;
        }
        else {
          std::operator+(&local_660,"\n",&local_970);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_660,local_4e0.first._M_dataplus._M_p,
                             local_4e0.first._M_string_length);
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar8 = &pbVar5->field_2;
          if (paVar9 == paVar8) {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928._M_dataplus._M_p = (pointer)paVar9;
          }
          local_928._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_928,"  if ( extension == \"");
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_9b0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_9b0,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar9;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_950,"\" ) { return \"");
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar9) {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
        pcVar1 = (pEVar15->obsoletedBy)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8a8,pcVar1,pcVar1 + (pEVar15->obsoletedBy)._M_string_length);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          uVar13 = local_908.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
            uVar13 = local_8a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length)
          goto LAB_0010f040;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_8a8,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
        }
        else {
LAB_0010f040:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_908,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0._M_dataplus._M_p = (pointer)paVar8;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9d0,"\"; }");
        local_990._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p == paVar9) {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_990.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_990._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_990._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_780,local_990._M_dataplus._M_p,local_990._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2)) {
          operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_8e8.first,&local_4e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_4e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.second._M_dataplus._M_p != &local_4e0.second.field_2) {
          operator_delete(local_4e0.second._M_dataplus._M_p,
                          local_4e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
          operator_delete(local_4e0.first._M_dataplus._M_p,
                          local_4e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar6);
  }
  if (local_970._M_string_length != 0) {
    std::operator+(&local_4e0.first,"\n",&local_970);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_780,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
      operator_delete(local_4e0.first._M_dataplus._M_p,
                      local_4e0.first.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_780,"\n  return \"\";");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  local_800._M_string_length = 0;
  local_800.field_2._M_local_buf[0] = '\0';
  local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  local_8e8.first._M_string_length = 0;
  local_8e8.first.field_2._M_allocated_capacity =
       local_8e8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_990.field_2;
    paVar7 = &local_908.field_2;
    do {
      if ((pEVar15->obsoletedBy)._M_string_length != 0) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_990,local_930,&pEVar15->name);
        generateProtection(&local_4e0,pVVar12,&local_990,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if (local_8e8.first._M_string_length == local_4e0.first._M_string_length) {
          if ((undefined1 *)local_8e8.first._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_8e8.first._M_dataplus._M_p,local_4e0.first._M_dataplus._M_p,
                         local_8e8.first._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928.field_2._M_allocated_capacity._0_2_ = 10;
          local_928._M_string_length = 1;
        }
        else {
          std::operator+(&local_640,"\n",&local_970);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_640,local_4e0.first._M_dataplus._M_p,
                             local_4e0.first._M_string_length);
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar8 = &pbVar5->field_2;
          if (paVar9 == paVar8) {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928._M_dataplus._M_p = (pointer)paVar9;
          }
          local_928._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_928,"{ \"");
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_9b0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_9b0,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar9;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_950,"\", \"");
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar9) {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
        pcVar1 = (pEVar15->obsoletedBy)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8a8,pcVar1,pcVar1 + (pEVar15->obsoletedBy)._M_string_length);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          uVar13 = local_908.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
            uVar13 = local_8a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length)
          goto LAB_0010f6b8;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_8a8,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
        }
        else {
LAB_0010f6b8:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_908,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0._M_dataplus._M_p = (pointer)paVar8;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9d0,"\"}, ");
        local_990._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p == paVar9) {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_990.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_990._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_990._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_800,local_990._M_dataplus._M_p,local_990._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p != &local_640.field_2)) {
          operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_8e8.first,&local_4e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_4e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.second._M_dataplus._M_p != &local_4e0.second.field_2) {
          operator_delete(local_4e0.second._M_dataplus._M_p,
                          local_4e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
          operator_delete(local_4e0.first._M_dataplus._M_p,
                          local_4e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_4e0.first._M_dataplus._M_p = (pointer)local_800._M_string_length;
    local_4e0.first._M_string_length = (size_type)local_800._M_dataplus._M_p;
    bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_4e0,", ");
    if (!bVar18) {
      pcVar10 = 
      "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:178:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:179:75)]"
      ;
      goto LAB_001121f1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4e0.first,&local_800,0,(size_type)(local_800._M_string_length - 2));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_800,&local_4e0.first);
    paVar17 = &local_4e0.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.first._M_dataplus._M_p != paVar17) {
      operator_delete(local_4e0.first._M_dataplus._M_p,
                      local_4e0.first.field_2._M_allocated_capacity + 1);
    }
    if (local_970._M_string_length != 0) {
      std::operator+(&local_4e0.first,"\n",&local_970);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_800,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.first._M_dataplus._M_p != paVar17) {
        operator_delete(local_4e0.first._M_dataplus._M_p,
                        local_4e0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  local_820._M_string_length = 0;
  local_820.field_2._M_local_buf[0] = '\0';
  local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  local_8e8.first._M_string_length = 0;
  local_8e8.first.field_2._M_allocated_capacity =
       local_8e8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_990.field_2;
    paVar7 = &local_908.field_2;
    do {
      if ((pEVar15->promotedTo)._M_string_length != 0) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_990,local_930,&pEVar15->name);
        generateProtection(&local_4e0,pVVar12,&local_990,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if (local_8e8.first._M_string_length == local_4e0.first._M_string_length) {
          if ((undefined1 *)local_8e8.first._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_8e8.first._M_dataplus._M_p,local_4e0.first._M_dataplus._M_p,
                         local_8e8.first._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928.field_2._M_allocated_capacity._0_2_ = 10;
          local_928._M_string_length = 1;
        }
        else {
          std::operator+(&local_620,"\n",&local_970);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_620,local_4e0.first._M_dataplus._M_p,
                             local_4e0.first._M_string_length);
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar8 = &pbVar5->field_2;
          if (paVar9 == paVar8) {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928._M_dataplus._M_p = (pointer)paVar9;
          }
          local_928._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_928,"{ \"");
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_9b0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_9b0,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar9;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_950,"\", \"");
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar9) {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
        pcVar1 = (pEVar15->promotedTo)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8a8,pcVar1,pcVar1 + (pEVar15->promotedTo)._M_string_length);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          uVar13 = local_908.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
            uVar13 = local_8a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length)
          goto LAB_0010fdb0;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_8a8,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
        }
        else {
LAB_0010fdb0:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_908,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0._M_dataplus._M_p = (pointer)paVar8;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9d0,"\"}, ");
        local_990._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p == paVar9) {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_990.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_990._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_990._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_820,local_990._M_dataplus._M_p,local_990._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2)) {
          operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_8e8.first,&local_4e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_4e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.second._M_dataplus._M_p != &local_4e0.second.field_2) {
          operator_delete(local_4e0.second._M_dataplus._M_p,
                          local_4e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
          operator_delete(local_4e0.first._M_dataplus._M_p,
                          local_4e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_4e0.first._M_dataplus._M_p = (pointer)local_820._M_string_length;
    local_4e0.first._M_string_length = (size_type)local_820._M_dataplus._M_p;
    bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_4e0,", ");
    if (!bVar18) {
      pcVar10 = 
      "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:180:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:181:74)]"
      ;
LAB_001121f1:
      __assert_fail("extensionsList.ends_with( \", \" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x28fe,pcVar10);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4e0.first,&local_820,0,(size_type)(local_820._M_string_length - 2));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_820,&local_4e0.first);
    paVar17 = &local_4e0.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.first._M_dataplus._M_p != paVar17) {
      operator_delete(local_4e0.first._M_dataplus._M_p,
                      local_4e0.first.field_2._M_allocated_capacity + 1);
    }
    if (local_970._M_string_length != 0) {
      std::operator+(&local_4e0.first,"\n",&local_970);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_820,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.first._M_dataplus._M_p != paVar17) {
        operator_delete(local_4e0.first._M_dataplus._M_p,
                        local_4e0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  local_7a0._M_string_length = 0;
  local_7a0.field_2._M_local_buf[0] = '\0';
  local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
  local_8e8.first._M_string_length = 0;
  local_8e8.first.field_2._M_allocated_capacity =
       local_8e8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_990.field_2;
    paVar7 = &local_908.field_2;
    do {
      if ((pEVar15->promotedTo)._M_string_length != 0) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_990,local_930,&pEVar15->name);
        generateProtection(&local_4e0,pVVar12,&local_990,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if (local_8e8.first._M_string_length == local_4e0.first._M_string_length) {
          if ((undefined1 *)local_8e8.first._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_8e8.first._M_dataplus._M_p,local_4e0.first._M_dataplus._M_p,
                         local_8e8.first._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928.field_2._M_allocated_capacity._0_2_ = 10;
          local_928._M_string_length = 1;
        }
        else {
          std::operator+(&local_600,"\n",&local_970);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_600,local_4e0.first._M_dataplus._M_p,
                             local_4e0.first._M_string_length);
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar8 = &pbVar5->field_2;
          if (paVar9 == paVar8) {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_928.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_928._M_dataplus._M_p = (pointer)paVar9;
          }
          local_928._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_928,"  if ( extension == \"");
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_9b0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_9b0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_9b0,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar8 = &pbVar5->field_2;
        if (paVar9 == paVar8) {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar9;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_950,"\" ) { return \"");
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar9) {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
        pcVar1 = (pEVar15->promotedTo)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8a8,pcVar1,pcVar1 + (pEVar15->promotedTo)._M_string_length);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          uVar13 = local_908.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
            uVar13 = local_8a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_8a8._M_string_length + local_908._M_string_length)
          goto LAB_001104a8;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_8a8,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
        }
        else {
LAB_001104a8:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_908,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar8 == paVar9) {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_9d0._M_dataplus._M_p = (pointer)paVar8;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9d0,"\"; }");
        local_990._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p == paVar9) {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_990.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_990._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_990.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_990._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_7a0,local_990._M_dataplus._M_p,local_990._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != paVar17) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != paVar7) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2)) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_8e8.first,&local_4e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_4e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.second._M_dataplus._M_p != &local_4e0.second.field_2) {
          operator_delete(local_4e0.second._M_dataplus._M_p,
                          local_4e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
          operator_delete(local_4e0.first._M_dataplus._M_p,
                          local_4e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar6);
  }
  if (local_970._M_string_length != 0) {
    std::operator+(&local_4e0.first,"\n",&local_970);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_7a0,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
      operator_delete(local_4e0.first._M_dataplus._M_p,
                      local_4e0.first.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_7a0,"\n  return \"\";");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
    operator_delete(local_8e8.first._M_dataplus._M_p,
                    local_8e8.first.field_2._M_allocated_capacity + 1);
  }
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  local_7c0._M_string_length = 0;
  local_7c0.field_2._M_local_buf[0] = '\0';
  __rhs = (local_930->m_features).
          super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (local_930->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pFVar2) {
    do {
      std::operator+(&local_8e8.first,"\"",&__rhs->name);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_8e8.first,"\", ");
      local_4e0.first._M_dataplus._M_p = (pointer)&local_4e0.first.field_2;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if (paVar17 == paVar7) {
        local_4e0.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_4e0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        local_4e0.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_4e0.first._M_dataplus._M_p = (pointer)paVar17;
      }
      local_4e0.first._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_7c0,local_4e0.first._M_dataplus._M_p,local_4e0.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
        operator_delete(local_4e0.first._M_dataplus._M_p,
                        local_4e0.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
        operator_delete(local_8e8.first._M_dataplus._M_p,
                        local_8e8.first.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pFVar2);
  }
  local_4e0.first._M_dataplus._M_p = (pointer)local_7c0._M_string_length;
  local_4e0.first._M_string_length = (size_type)local_7c0._M_dataplus._M_p;
  bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_4e0,", ");
  if (!bVar18) {
    __assert_fail("versions.ends_with( \", \" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0xbe,"void VulkanHppGenerator::generateExtensionInspectionFile() const");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_4e0.first,&local_7c0,0,(size_type)(local_7c0._M_string_length + -2));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_7c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.first._M_dataplus._M_p != &local_4e0.first.field_2) {
    operator_delete(local_4e0.first._M_dataplus._M_p,
                    local_4e0.first.field_2._M_allocated_capacity + 1);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4e0,(char (*) [4])0x243e69,&local_930->m_api);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_true>(&local_4a0,(char (*) [21])"deprecatedExtensions",&local_7e0);
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"device","");
  generateExtensionsList(&local_540,local_930,&local_6c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_460,(char (*) [17])"deviceExtensions",&local_540);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"device","");
  generateExtensionTypeTest(&local_560,local_930,&local_6e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_420,(char (*) [11])"deviceTest",&local_560);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_true>(&local_3e0,(char (*) [13])"deprecatedBy",&local_760);
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  local_840._M_string_length = 0;
  local_840.field_2._M_local_buf[0] = '\0';
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  local_990._M_string_length = 0;
  local_990.field_2._M_allocated_capacity =
       local_990.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (local_930->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != pEVar6) {
    paVar17 = &local_9d0.field_2;
    local_888 = pEVar6;
    do {
      if (pEVar15->isDeprecated == true) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_9d0,local_930,&pEVar15->name);
        generateProtection(&local_8e8,pVVar12,&local_9d0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != paVar17) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if (local_970._M_string_length == local_8e8.first._M_string_length) {
          if ((undefined1 *)local_970._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_970._M_dataplus._M_p,local_8e8.first._M_dataplus._M_p,
                         local_970._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          local_9b0.field_2._M_allocated_capacity._0_2_ = 10;
          local_9b0._M_string_length = 1;
        }
        else {
          std::operator+(&local_5e0,"\n",&local_990);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_5e0,local_8e8.first._M_dataplus._M_p,
                             local_8e8.first._M_string_length);
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar7 == paVar9) {
            local_9b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_9b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_9b0._M_dataplus._M_p = (pointer)paVar7;
          }
          local_9b0._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9b0,"( extension == \"");
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar7 == paVar9) {
          local_950.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar7;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_950,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar7) {
          local_908.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_908,"\" ) || ");
        local_9d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p == paVar7) {
          local_9d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_9d0._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_840,local_9d0._M_dataplus._M_p,local_9d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != paVar17) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != &local_908.field_2) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2)) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_8e8.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_990,&local_8e8.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8.second._M_dataplus._M_p != &local_8e8.second.field_2) {
          operator_delete(local_8e8.second._M_dataplus._M_p,
                          local_8e8.second.field_2._M_allocated_capacity + 1);
        }
        pEVar6 = local_888;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
          operator_delete(local_8e8.first._M_dataplus._M_p,
                          local_8e8.first.field_2._M_allocated_capacity + 1);
          pEVar6 = local_888;
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar6);
  }
  if (local_990._M_string_length == 0) {
    local_8e8.first._M_dataplus._M_p = (pointer)local_840._M_string_length;
    local_8e8.first._M_string_length = (size_type)local_840._M_dataplus._M_p;
    bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_8e8," || ");
    if (!bVar18) {
      pcVar10 = 
      "std::string VulkanHppGenerator::generateExtensionReplacedTest(Predicate) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:200:74)]"
      ;
      goto LAB_0011223e;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_8e8.first,&local_840,0,(size_type)(local_840._M_string_length + -4));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_840,&local_8e8.first);
    uVar13 = local_8e8.first.field_2._M_allocated_capacity;
    _Var14._M_p = local_8e8.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) goto LAB_00110f6d;
  }
  else {
    std::operator+(&local_9d0,"\n",&local_990);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_9d0,"false");
    local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if (paVar17 == paVar7) {
      local_8e8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_8e8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      local_8e8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_8e8.first._M_dataplus._M_p = (pointer)paVar17;
    }
    local_8e8.first._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_840,local_8e8.first._M_dataplus._M_p,local_8e8.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
      operator_delete(local_8e8.first._M_dataplus._M_p,
                      local_8e8.first.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_9d0.field_2._M_allocated_capacity;
    _Var14._M_p = local_9d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
LAB_00110f6d:
      operator_delete(_Var14._M_p,uVar13 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3a0,(char (*) [15])"deprecatedTest",&local_840);
  generateExtensionDependencies_abi_cxx11_(&local_580,local_930);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [22])"extensionDependencies",&local_580);
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"instance","");
  generateExtensionsList(&local_5a0,local_930,&local_700);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[19],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_320,(char (*) [19])"instanceExtensions",&local_5a0);
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"instance","");
  generateExtensionTypeTest(&local_5c0,local_930,&local_720);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2e0,(char (*) [13])"instanceTest",&local_5c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>
            (&local_2a0,(char (*) [14])"licenseHeader",&local_930->m_vulkanLicenseHeader);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_true>(&local_260,(char (*) [12])"obsoletedBy",&local_780);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_true>(&local_220,(char (*) [20])"obsoletedExtensions",&local_800);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  local_860._M_string_length = 0;
  local_860.field_2._M_local_buf[0] = '\0';
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  local_990._M_string_length = 0;
  local_990.field_2._M_allocated_capacity =
       local_990.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_888 = (local_930->m_extensions).
              super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != local_888) {
    paVar17 = &local_9d0.field_2;
    do {
      if ((pEVar15->obsoletedBy)._M_string_length != 0) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_9d0,local_930,&pEVar15->name);
        generateProtection(&local_8e8,pVVar12,&local_9d0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != paVar17) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if (local_970._M_string_length == local_8e8.first._M_string_length) {
          if ((undefined1 *)local_970._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_970._M_dataplus._M_p,local_8e8.first._M_dataplus._M_p,
                         local_970._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          local_9b0.field_2._M_allocated_capacity._0_2_ = 10;
          local_9b0._M_string_length = 1;
        }
        else {
          std::operator+(&local_8a8,"\n",&local_990);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_8a8,local_8e8.first._M_dataplus._M_p,
                             local_8e8.first._M_string_length);
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar7 == paVar9) {
            local_9b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_9b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_9b0._M_dataplus._M_p = (pointer)paVar7;
          }
          local_9b0._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9b0,"( extension == \"");
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar7 == paVar9) {
          local_950.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar7;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_950,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar7) {
          local_908.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_908,"\" ) || ");
        local_9d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p == paVar7) {
          local_9d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_9d0._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_860,local_9d0._M_dataplus._M_p,local_9d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != paVar17) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != &local_908.field_2) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2)) {
          operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_8e8.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_990,&local_8e8.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8.second._M_dataplus._M_p != &local_8e8.second.field_2) {
          operator_delete(local_8e8.second._M_dataplus._M_p,
                          local_8e8.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
          operator_delete(local_8e8.first._M_dataplus._M_p,
                          local_8e8.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != local_888);
  }
  if (local_990._M_string_length == 0) {
    local_8e8.first._M_dataplus._M_p = (pointer)local_860._M_string_length;
    local_8e8.first._M_string_length = (size_type)local_860._M_dataplus._M_p;
    bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_8e8," || ");
    if (!bVar18) {
      pcVar10 = 
      "std::string VulkanHppGenerator::generateExtensionReplacedTest(Predicate) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:207:73)]"
      ;
      goto LAB_0011223e;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_8e8.first,&local_860,0,(size_type)(local_860._M_string_length + -4));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_860,&local_8e8.first);
    uVar13 = local_8e8.first.field_2._M_allocated_capacity;
    _Var14._M_p = local_8e8.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) goto LAB_001115f6;
  }
  else {
    std::operator+(&local_9d0,"\n",&local_990);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_9d0,"false");
    local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if (paVar17 == paVar7) {
      local_8e8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_8e8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      local_8e8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_8e8.first._M_dataplus._M_p = (pointer)paVar17;
    }
    local_8e8.first._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_860,local_8e8.first._M_dataplus._M_p,local_8e8.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
      operator_delete(local_8e8.first._M_dataplus._M_p,
                      local_8e8.first.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_9d0.field_2._M_allocated_capacity;
    _Var14._M_p = local_9d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
LAB_001115f6:
      operator_delete(_Var14._M_p,uVar13 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1e0,(char (*) [14])"obsoletedTest",&local_860);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_true>(&local_1a0,(char (*) [19])"promotedExtensions",&local_820);
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  local_880._M_string_length = 0;
  local_880.field_2._M_local_buf[0] = '\0';
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  local_990._M_string_length = 0;
  local_990.field_2._M_allocated_capacity =
       local_990.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pEVar15 = (local_930->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_888 = (local_930->m_extensions).
              super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar15 != local_888) {
    paVar17 = &local_9d0.field_2;
    do {
      if ((pEVar15->promotedTo)._M_string_length != 0) {
        pVVar12 = local_930;
        getProtectFromTitle(&local_9d0,local_930,&pEVar15->name);
        generateProtection(&local_8e8,pVVar12,&local_9d0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != paVar17) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if (local_970._M_string_length == local_8e8.first._M_string_length) {
          if ((undefined1 *)local_970._M_string_length == (undefined1 *)0x0) {
            bVar18 = true;
          }
          else {
            iVar4 = bcmp(local_970._M_dataplus._M_p,local_8e8.first._M_dataplus._M_p,
                         local_970._M_string_length);
            bVar18 = iVar4 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          local_9b0.field_2._M_allocated_capacity._0_2_ = 10;
          local_9b0._M_string_length = 1;
        }
        else {
          std::operator+(&local_928,"\n",&local_990);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_928,local_8e8.first._M_dataplus._M_p,
                             local_8e8.first._M_string_length);
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar5->_M_dataplus)._M_p;
          paVar9 = &pbVar5->field_2;
          if (paVar7 == paVar9) {
            local_9b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_9b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          }
          else {
            local_9b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_9b0._M_dataplus._M_p = (pointer)paVar7;
          }
          local_9b0._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_9b0,"( extension == \"");
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar9 = &pbVar5->field_2;
        if (paVar7 == paVar9) {
          local_950.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_950.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_950.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_950._M_dataplus._M_p = (pointer)paVar7;
        }
        local_950._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_950,(pEVar15->name)._M_dataplus._M_p,
                           (pEVar15->name)._M_string_length);
        local_908._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p == paVar7) {
          local_908.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_908.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
        }
        else {
          local_908.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_908._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_908,"\" ) || ");
        local_9d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p == paVar7) {
          local_9d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_9d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_9d0._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_9d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_9d0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_880,local_9d0._M_dataplus._M_p,local_9d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != paVar17) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_908._M_dataplus._M_p != &local_908.field_2) {
          operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2)) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_970,&local_8e8.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_990,&local_8e8.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8.second._M_dataplus._M_p != &local_8e8.second.field_2) {
          operator_delete(local_8e8.second._M_dataplus._M_p,
                          local_8e8.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
          operator_delete(local_8e8.first._M_dataplus._M_p,
                          local_8e8.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != local_888);
  }
  if (local_990._M_string_length == 0) {
    local_8e8.first._M_dataplus._M_p = (pointer)local_880._M_string_length;
    local_8e8.first._M_string_length = (size_type)local_880._M_dataplus._M_p;
    bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_8e8," || ");
    if (!bVar18) {
      pcVar10 = 
      "std::string VulkanHppGenerator::generateExtensionReplacedTest(Predicate) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:209:72)]"
      ;
LAB_0011223e:
      __assert_fail("replacedTest.ends_with( \" || \" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x1dac,pcVar10);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_8e8.first,&local_880,0,(size_type)(local_880._M_string_length + -4));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_880,&local_8e8.first);
    uVar13 = local_8e8.first.field_2._M_allocated_capacity;
    _Var14._M_p = local_8e8.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.first._M_dataplus._M_p == &local_8e8.first.field_2) goto LAB_00111b4b;
  }
  else {
    std::operator+(&local_9d0,"\n",&local_990);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_9d0,"false");
    local_8e8.first._M_dataplus._M_p = (pointer)&local_8e8.first.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if (paVar17 == paVar7) {
      local_8e8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_8e8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      local_8e8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_8e8.first._M_dataplus._M_p = (pointer)paVar17;
    }
    local_8e8.first._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_880,local_8e8.first._M_dataplus._M_p,local_8e8.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.first._M_dataplus._M_p != &local_8e8.first.field_2) {
      operator_delete(local_8e8.first._M_dataplus._M_p,
                      local_8e8.first.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_9d0.field_2._M_allocated_capacity;
    _Var14._M_p = local_9d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p == &local_9d0.field_2) goto LAB_00111b4b;
  }
  operator_delete(_Var14._M_p,uVar13 + 1);
LAB_00111b4b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,
                    CONCAT71(local_970.field_2._M_allocated_capacity._1_7_,
                             local_970.field_2._M_local_buf[0]) + 1);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_160,(char (*) [13])"promotedTest",&local_880);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_true>(&local_120,(char (*) [11])"promotedTo",&local_7a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_e0,(char (*) [9])"versions",&local_7c0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_930->m_api,"vulkan");
  local_8e8.first._M_dataplus._M_p = "(void)extension;";
  if (iVar4 == 0) {
    local_8e8.first._M_dataplus._M_p = "";
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_*,_true>
            (&local_a0,(char (*) [14])"voidExtension",(char **)&local_8e8);
  __l._M_len = 0x12;
  __l._M_array = (iterator)&local_4e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_970,(allocator_type *)&local_990);
  replaceWithMap(&local_520,&local_500,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  lVar11 = -0x480;
  paVar17 = &local_a0.second.field_2;
  do {
    if (paVar17 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar17->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar17->_M_allocated_capacity)[-2],
                      paVar17->_M_allocated_capacity + 1);
    }
    if (&paVar17->_M_allocated_capacity + -4 != (size_type *)(&paVar17->_M_allocated_capacity)[-6])
    {
      operator_delete((size_type *)(&paVar17->_M_allocated_capacity)[-6],
                      (&paVar17->_M_allocated_capacity)[-4] + 1);
    }
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar17->_M_allocated_capacity + -8);
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,
                    CONCAT71(local_880.field_2._M_allocated_capacity._1_7_,
                             local_880.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,
                    CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                             local_860.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,
                    CONCAT71(local_840.field_2._M_allocated_capacity._1_7_,
                             local_840.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  writeToFile(&local_520,&local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,
                    CONCAT71(local_7c0.field_2._M_allocated_capacity._1_7_,
                             local_7c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,
                    CONCAT71(local_7a0.field_2._M_allocated_capacity._1_7_,
                             local_7a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,
                    CONCAT71(local_820.field_2._M_allocated_capacity._1_7_,
                             local_820.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    operator_delete(local_800._M_dataplus._M_p,
                    CONCAT71(local_800.field_2._M_allocated_capacity._1_7_,
                             local_800.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,
                    CONCAT71(local_780.field_2._M_allocated_capacity._1_7_,
                             local_780.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,
                    CONCAT71(local_760.field_2._M_allocated_capacity._1_7_,
                             local_760.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,
                    CONCAT71(local_7e0.field_2._M_allocated_capacity._1_7_,
                             local_7e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::generateExtensionInspectionFile() const
{
  std::string const vulkan_extension_inspection_hpp = std::string( BASE_PATH ) + "/vulkan/" + m_api + "_extension_inspection.hpp";
  messager.message( "VulkanHppGenerator: Generating " + vulkan_extension_inspection_hpp + " ...\n" );

  std::string const vulkanExtensionInspectionHppTemplate = readSnippet( "ExtensionInspection.hpp" );
  std::string const deprecatedExtensions = generateReplacedExtensionsList( []( ExtensionData const & extension ) { return extension.isDeprecated; },
                                                                           []( ExtensionData const & extension ) { return extension.deprecatedBy; } );
  std::string const deprecatedBy         = generateExtensionReplacedBy( []( ExtensionData const & extension ) { return extension.isDeprecated; },
                                                                []( ExtensionData const & extension ) { return extension.deprecatedBy; } );
  std::string const obsoletedBy          = generateExtensionReplacedBy( []( ExtensionData const & extension ) { return !extension.obsoletedBy.empty(); },
                                                               []( ExtensionData const & extension ) { return extension.obsoletedBy; } );
  std::string const obsoletedExtensions  = generateReplacedExtensionsList( []( ExtensionData const & extension ) { return !extension.obsoletedBy.empty(); },
                                                                          []( ExtensionData const & extension ) { return extension.obsoletedBy; } );
  std::string const promotedExtensions   = generateReplacedExtensionsList( []( ExtensionData const & extension ) { return !extension.promotedTo.empty(); },
                                                                         []( ExtensionData const & extension ) { return extension.promotedTo; } );
  std::string const promotedTo           = generateExtensionReplacedBy( []( ExtensionData const & extension ) { return !extension.promotedTo.empty(); },
                                                              []( ExtensionData const & extension ) { return extension.promotedTo; } );

  std::string versions;
  for ( auto const & feature : m_features )
  {
    versions += "\"" + feature.name + "\", ";
  }
  assert( versions.ends_with( ", " ) );
  versions = versions.substr( 0, versions.length() - 2 );

  std::string str =
    replaceWithMap( vulkanExtensionInspectionHppTemplate,
                    { { "api", m_api },
                      { "deprecatedExtensions", deprecatedExtensions },
                      { "deviceExtensions", generateExtensionsList( "device" ) },
                      { "deviceTest", generateExtensionTypeTest( "device" ) },
                      { "deprecatedBy", deprecatedBy },
                      { "deprecatedTest", generateExtensionReplacedTest( []( ExtensionData const & extension ) { return extension.isDeprecated; } ) },
                      { "extensionDependencies", generateExtensionDependencies() },
                      { "instanceExtensions", generateExtensionsList( "instance" ) },
                      { "instanceTest", generateExtensionTypeTest( "instance" ) },
                      { "licenseHeader", m_vulkanLicenseHeader },
                      { "obsoletedBy", obsoletedBy },
                      { "obsoletedExtensions", obsoletedExtensions },
                      { "obsoletedTest", generateExtensionReplacedTest( []( ExtensionData const & extension ) { return !extension.obsoletedBy.empty(); } ) },
                      { "promotedExtensions", promotedExtensions },
                      { "promotedTest", generateExtensionReplacedTest( []( ExtensionData const & extension ) { return !extension.promotedTo.empty(); } ) },
                      { "promotedTo", promotedTo },
                      { "versions", versions },
                      { "voidExtension", ( m_api == "vulkan" ) ? "" : "(void)extension;" } } );

  writeToFile( str, vulkan_extension_inspection_hpp );
}